

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_utter_heal(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int sn_00;
  int sn_01;
  int *piVar2;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  undefined4 in_R8D;
  int sn_poison;
  int sn_atrophy;
  CHAR_DATA *victim;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar1 = is_evil((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (bVar1) {
    send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
  }
  else {
    sn_00 = skill_lookup((char *)in_RCX);
    sn_01 = skill_lookup((char *)in_RCX);
    bVar1 = is_affected(in_RCX,sn_00);
    if (bVar1) {
      affect_strip((CHAR_DATA *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                   (int)((ulong)in_RCX >> 0x20));
      send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
      act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,(void *)CONCAT44(sn_00,sn_01),
          (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    }
    else {
      bVar1 = is_affected(in_RDX,sn_01);
      if ((bVar1) || (bVar1 = is_affected(in_RDX,(int)gsn_poison_dust), bVar1)) {
        act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,(void *)CONCAT44(sn_00,sn_01),
            (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
        affect_strip((CHAR_DATA *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RCX >> 0x20));
        affect_strip((CHAR_DATA *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RCX >> 0x20));
      }
      bVar1 = is_affected(in_RDX,(int)gsn_plague);
      if (bVar1) {
        act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,(void *)CONCAT44(sn_00,sn_01),
            (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
        affect_strip((CHAR_DATA *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RCX >> 0x20));
      }
      send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
      piVar2 = std::min<int>((int *)&stack0xffffffffffffffcc,(int *)&stack0xffffffffffffffc8);
      in_RCX->hit = *piVar2;
      if (in_RCX != in_RDX) {
        send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
      }
    }
  }
  return;
}

Assistant:

void spell_utter_heal(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int sn_atrophy, sn_poison;

	if (is_evil(ch))
	{
		send_to_char("The Gods of darkness do not grant such beneficial spells to their clerics.\n\r", ch);
		return;
	}

	sn_atrophy = skill_lookup("atrophy");
	sn_poison = skill_lookup("poison");

	if (is_affected(victim, sn_atrophy))
	{
		affect_strip(victim, sn_atrophy);
		send_to_char("Your body stops wasting away.\n\r", victim);
		act("$n's body stops wasting away.", victim, 0, 0, TO_ROOM);
		return;
	}

	if (is_affected(ch, sn_poison) || is_affected(ch, gsn_poison_dust))
	{
		act("$n looks better.", victim, 0, 0, TO_ROOM);
		send_to_char("You feel a warm sensation running through you.\n\r", victim);
		affect_strip(victim, sn_poison);
		affect_strip(victim, gsn_poison_dust);
	}

	if (is_affected(ch, gsn_plague))
	{
		act("The sores on $n's body disappear.", victim, 0, 0, TO_ROOM);
		send_to_char("The sores on your body disappear.\n\r", victim);
		affect_strip(victim, gsn_plague);
	}

	send_to_char("You feel better!\n\r", victim);

	victim->hit = std::min(victim->hit + 100, (int)victim->max_hit);

	if (victim != ch)
		send_to_char("Ok.\n\r", ch);
}